

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_templates.cpp
# Opt level: O1

int main(void)

{
  int i;
  shared_ptr<hello<world<int>,_int>_> hw;
  i injector;
  undefined4 local_34;
  int *local_30;
  scope<boost::ext::di::v1_3_0::concepts::any_of<Number,_int>,_int_&,_int> local_28;
  undefined4 *local_18;
  
  local_18 = &local_34;
  local_34 = 0x2a;
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_Type,_boost::ext::di::v1_3_0::aux::identity<world<int>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::concepts::any_of<Number,_int>,_int_&,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  ::create<std::shared_ptr<hello<world<int>,_int>_>,_0>
            ((injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_Type,_boost::ext::di::v1_3_0::aux::identity<world<int>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::concepts::any_of<Number,_int>,_int_&,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
              *)&local_30);
  if (*local_30 == 0x2a) {
    if (local_28.object_.object != (int *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28.object_.object);
    }
    return 0;
  }
  __assert_fail("42 == hw->number",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bind_templates.cpp"
                ,0x38,"int main()");
}

Assistant:

int main() {
  auto i = 42;

  // clang-format off
  const auto injector = di::make_injector(
     di::bind<class Type>().to<world>()
   , di::bind<class Number>().to<int>(i)
  );
  // clang-format on

  {
    const auto hw = injector.create<hello>();

    static_assert(std::is_same<int, decltype(hw)::type::type>{}, "Type != int");
    assert(42 == hw.number);
  }

  {
    const auto hw = injector.create<std::shared_ptr<decltype(injector.create<hello>())>>();

    static_assert(std::is_same<int, decltype(hw)::element_type::type::type>{}, "Type != int");
    assert(42 == hw->number);
  }
}